

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall
CNetBase::SendPacketConnless
          (CNetBase *this,NETADDR *pAddr,TOKEN Token,TOKEN ResponseToken,void *pData,int DataSize)

{
  long lVar1;
  NETSOCKET sock;
  undefined4 uVar2;
  undefined8 in_RSI;
  void *in_RDI;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  int i;
  uchar aBuffer [1400];
  int in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  int line;
  char *filename;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)in_RDI;
  filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
  ;
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
                 ,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18,(char *)0x24478e);
  line = 1;
  dbg_assert_imp(filename,1,in_stack_fffffffffffffa18,(char *)0x2447ad);
  dbg_assert_imp(filename,line,in_stack_fffffffffffffa18,(char *)0x2447c7);
  uVar2 = 9;
  dbg_assert_imp(filename,line,in_stack_fffffffffffffa18,(char *)0x2448ac);
  mem_copy(filename,(void *)CONCAT44(line,in_stack_fffffffffffffa18),0);
  sock.ipv6sock = iVar3;
  sock.type = (int)in_RSI;
  sock.ipv4sock = (int)((ulong)in_RSI >> 0x20);
  net_udp_send(sock,(NETADDR *)CONCAT44(in_R9D,uVar2),in_RDI,(int)((ulong)filename >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBase::SendPacketConnless(const NETADDR *pAddr, TOKEN Token, TOKEN ResponseToken, const void *pData, int DataSize)
{
	unsigned char aBuffer[NET_MAX_PACKETSIZE];

	dbg_assert(DataSize <= NET_MAX_PAYLOAD, "packet data size too high");
	dbg_assert((Token&~NET_TOKEN_MASK) == 0, "token out of range");
	dbg_assert((ResponseToken&~NET_TOKEN_MASK) == 0, "resp token out of range");

	int i = 0;
	aBuffer[i++] = ((NET_PACKETFLAG_CONNLESS<<2)&0xfc) | (NET_PACKETVERSION&0x03); // connless flag and version
	aBuffer[i++] = (Token>>24)&0xff; // token
	aBuffer[i++] = (Token>>16)&0xff;
	aBuffer[i++] = (Token>>8)&0xff;
	aBuffer[i++] = (Token)&0xff;
	aBuffer[i++] = (ResponseToken>>24)&0xff; // response token
	aBuffer[i++] = (ResponseToken>>16)&0xff;
	aBuffer[i++] = (ResponseToken>>8)&0xff;
	aBuffer[i++] = (ResponseToken)&0xff;

	dbg_assert(i == NET_PACKETHEADERSIZE_CONNLESS, "inconsistency");

	mem_copy(&aBuffer[i], pData, DataSize);
	net_udp_send(m_Socket, pAddr, aBuffer, i+DataSize);
}